

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svggeometryelement.cpp
# Opt level: O0

void __thiscall
lunasvg::SVGGeometryElement::layoutElement(SVGGeometryElement *this,SVGLayoutState *state)

{
  FillRule FVar1;
  Paint *pPVar2;
  float fVar3;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  undefined8 in_XMM1_Qa;
  SVGPaintServer SVar4;
  StrokeData local_60;
  SVGPaintServer local_38;
  SVGPaintServer local_28;
  SVGLayoutState *local_18;
  SVGLayoutState *state_local;
  SVGGeometryElement *this_local;
  
  local_18 = state;
  state_local = (SVGLayoutState *)this;
  FVar1 = SVGLayoutState::fill_rule(state);
  this->m_fill_rule = FVar1;
  FVar1 = SVGLayoutState::clip_rule(local_18);
  this->m_clip_rule = FVar1;
  pPVar2 = SVGLayoutState::fill(local_18);
  fVar3 = SVGLayoutState::fill_opacity(local_18);
  SVar4 = SVGGraphicsElement::getPaintServer(&this->super_SVGGraphicsElement,pPVar2,fVar3);
  local_28.m_element = SVar4.m_element;
  local_28._8_8_ = SVar4._8_8_;
  (this->m_fill).m_element = local_28.m_element;
  (this->m_fill).m_color = (Color)local_28.m_color.m_value;
  (this->m_fill).m_opacity = local_28.m_opacity;
  local_28 = SVar4;
  pPVar2 = SVGLayoutState::stroke(local_18);
  fVar3 = SVGLayoutState::stroke_opacity(local_18);
  SVar4 = SVGGraphicsElement::getPaintServer(&this->super_SVGGraphicsElement,pPVar2,fVar3);
  local_38.m_element = SVar4.m_element;
  local_38._8_8_ = SVar4._8_8_;
  (this->m_stroke).m_element = local_38.m_element;
  (this->m_stroke).m_color = (Color)local_38.m_color.m_value;
  (this->m_stroke).m_opacity = local_38.m_opacity;
  local_38 = SVar4;
  SVGGraphicsElement::getStrokeData(&local_60,&this->super_SVGGraphicsElement,local_18);
  StrokeData::operator=(&this->m_strokeData,&local_60);
  StrokeData::~StrokeData(&local_60);
  SVGElement::layoutElement((SVGElement *)this,local_18);
  Path::reset(&this->m_path);
  std::vector<lunasvg::SVGMarkerPosition,_std::allocator<lunasvg::SVGMarkerPosition>_>::clear
            (&this->m_markerPositions);
  (*(this->super_SVGGraphicsElement).super_SVGElement.super_SVGNode._vptr_SVGNode[0x12])
            (this,&this->m_path);
  (this->m_fillBoundingBox).x = (float)extraout_XMM0_Da;
  (this->m_fillBoundingBox).y = (float)extraout_XMM0_Db;
  (this->m_fillBoundingBox).w = (float)(int)in_XMM1_Qa;
  (this->m_fillBoundingBox).h = (float)(int)((ulong)in_XMM1_Qa >> 0x20);
  updateMarkerPositions(this,&this->m_markerPositions,local_18);
  return;
}

Assistant:

void SVGGeometryElement::layoutElement(const SVGLayoutState& state)
{
    m_fill_rule = state.fill_rule();
    m_clip_rule = state.clip_rule();
    m_fill = getPaintServer(state.fill(), state.fill_opacity());
    m_stroke = getPaintServer(state.stroke(), state.stroke_opacity());
    m_strokeData = getStrokeData(state);
    SVGGraphicsElement::layoutElement(state);

    m_path.reset();
    m_markerPositions.clear();
    m_fillBoundingBox = updateShape(m_path);
    updateMarkerPositions(m_markerPositions, state);
}